

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oslib-posix.c
# Opt level: O1

void * qemu_anon_ram_alloc(uc_struct *uc,size_t size,uint64_t *alignment)

{
  size_t __len;
  ulong uVar1;
  void *__addr;
  void *pvVar2;
  void *__addr_00;
  size_t __len_00;
  size_t __len_01;
  
  __len = size + 0x200000;
  uVar1 = uc->qemu_real_host_page_size;
  __addr = mmap64((void *)0x0,__len,0,0x22,-1,0);
  pvVar2 = (void *)0xffffffffffffffff;
  if (__addr != (void *)0xffffffffffffffff) {
    if (0x200000 < uVar1) {
      __assert_fail("align >= pagesize",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/util/oslib-posix.c"
                    ,0xe5,"void *qemu_ram_mmap(struct uc_struct *, size_t, size_t, _Bool)");
    }
    __addr_00 = (void *)((long)__addr + 0x1fffffU & 0xffffffffffe00000);
    pvVar2 = mmap64(__addr_00,size,3,0x32,-1,0);
    if (pvVar2 == (void *)0xffffffffffffffff) {
      munmap(__addr,__len);
      pvVar2 = (void *)0xffffffffffffffff;
    }
    else {
      __len_00 = (long)__addr_00 - (long)__addr;
      if (__len_00 != 0) {
        munmap(__addr,__len_00);
      }
      __len_01 = (__len - __len_00) - (uVar1 + size);
      if (uVar1 + size <= __len - __len_00 && __len_01 != 0) {
        munmap((void *)((long)pvVar2 + uVar1 + size),__len_01);
      }
    }
  }
  if (pvVar2 == (void *)0xffffffffffffffff) {
    pvVar2 = (void *)0x0;
  }
  else if (alignment != (uint64_t *)0x0) {
    *alignment = 0x200000;
  }
  return pvVar2;
}

Assistant:

void *qemu_anon_ram_alloc(struct uc_struct *uc, size_t size, uint64_t *alignment)
{
#ifdef __MINGW32__
    void *ptr;

    ptr = VirtualAlloc(NULL, size, MEM_COMMIT, PAGE_READWRITE);
    // trace_qemu_anon_ram_alloc(size, ptr);

    if (ptr && alignment) {
        *alignment = MAX(get_allocation_granularity(), getpagesize());
    }
    return ptr;
#else
    size_t align = QEMU_VMALLOC_ALIGN;
    void *ptr = qemu_ram_mmap(uc, size, align, false);

    if (ptr == MAP_FAILED) {
        return NULL;
    }

    if (alignment) {
        *alignment = align;
    }

    //trace_qemu_anon_ram_alloc(size, ptr);
    return ptr;
#endif
}